

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

sysbvm_tuple_t sysbvm_tuple_defaultPrintString(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  
  sVar2 = sysbvm_tuple_getType(context,tuple);
  if (sVar2 != 0) {
    sVar4 = (context->roots).typeType;
    if (((sVar4 != 0) && ((((uint)sVar4 | (uint)sVar2) & 0xf) == 0)) &&
       (_Var1 = sysbvm_tuple_isDummyValue(sVar2), sVar3 = sVar2, !_Var1)) {
      for (; sVar3 != 0; sVar3 = *(sysbvm_tuple_t *)(sVar3 + 0x30)) {
        if (sVar3 == sVar4) {
          sVar4 = sysbvm_type_getName(tuple);
          if (sVar4 != 0 && (sVar4 & 0xf) == 0) {
            return sVar4;
          }
          break;
        }
      }
    }
    sVar2 = sysbvm_type_getName(sVar2);
    if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
      sVar2 = sysbvm_string_createWithPrefix(context,"a ",sVar2);
      return sVar2;
    }
  }
  sVar2 = sysbvm_string_createWithCString(context,"TODO: defaultPrintString");
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_defaultPrintString(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    if(type != SYSBVM_NULL_TUPLE)
    {
        // Is the tuple a type?
        if(sysbvm_type_isDirectSubtypeOf(type, context->roots.typeType))
        {
            sysbvm_tuple_t thisTypeName = sysbvm_type_getName(tuple);
            if(sysbvm_tuple_isNonNullPointer(thisTypeName))   
                return thisTypeName;
        }

        sysbvm_tuple_t typeName = sysbvm_type_getName(type);
        if(sysbvm_tuple_isNonNullPointer(typeName))
            return sysbvm_string_createWithPrefix(context, "a ", typeName);
    }

    return sysbvm_string_createWithCString(context, "TODO: defaultPrintString");
}